

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O0

int __thiscall pstore::region::file_based_factory::init(file_based_factory *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<pstore::file::file_handle> local_28;
  EVP_PKEY_CTX *local_18;
  file_based_factory *this_local;
  
  local_18 = ctx;
  this_local = this;
  std::shared_ptr<pstore::file::file_handle>::shared_ptr
            (&local_28,(shared_ptr<pstore::file::file_handle> *)(ctx + 0x18));
  factory::create<pstore::file::file_handle,pstore::memory_mapper>
            ((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              *)this,(factory *)ctx,&local_28);
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr(&local_28);
  return (int)this;
}

Assistant:

auto file_based_factory::init () -> std::vector<memory_mapper_ptr> {
            return this->create<file::file_handle, memory_mapper> (file_);
        }